

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstSerialise.cpp
# Opt level: O3

string * __thiscall
enact::AstSerialise::visitIfExpr_abi_cxx11_
          (string *__return_storage_ptr__,AstSerialise *this,IfExpr *expr)

{
  undefined1 *puVar1;
  Expr *pEVar2;
  BlockExpr *pBVar3;
  ostream *poVar4;
  stringstream s;
  char local_1d9;
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(this->m_ident)._M_dataplus._M_p,(this->m_ident)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(Expr::If ",10);
  puVar1 = &this->field_0x8;
  pEVar2 = (expr->condition)._M_t.
           super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>._M_t.
           super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
           super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl;
  (*pEVar2->_vptr_Expr[2])(&local_1d8,pEVar2,puVar1);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_1d8,local_1d0);
  local_1d9 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_1d9,1);
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  std::__cxx11::string::append((char *)&this->m_ident);
  pBVar3 = (expr->thenBody)._M_t.
           super___uniq_ptr_impl<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>._M_t.
           super__Tuple_impl<0UL,_enact::BlockExpr_*,_std::default_delete<enact::BlockExpr>_>.
           super__Head_base<0UL,_enact::BlockExpr_*,_false>._M_head_impl;
  (*(pBVar3->super_Expr)._vptr_Expr[2])(&local_1d8,pBVar3,puVar1);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_1d8,local_1d0)
  ;
  local_1d9 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_1d9,1);
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  pBVar3 = (expr->elseBody)._M_t.
           super___uniq_ptr_impl<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>._M_t.
           super__Tuple_impl<0UL,_enact::BlockExpr_*,_std::default_delete<enact::BlockExpr>_>.
           super__Head_base<0UL,_enact::BlockExpr_*,_false>._M_head_impl;
  (*(pBVar3->super_Expr)._vptr_Expr[2])(&local_1d8,pBVar3,puVar1);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_1d8,local_1d0)
  ;
  local_1d9 = ')';
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_1d9,1);
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  std::__cxx11::string::erase((ulong)&this->m_ident,0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string AstSerialise::visitIfExpr(IfExpr& expr) {
        std::stringstream s;

        s << m_ident << "(Expr::If " << visitExpr(*expr.condition) << '\n';
        m_ident += "    ";

        s << visitExpr(*expr.thenBody) << '\n';
        s << visitExpr(*expr.elseBody) << ')';

        m_ident.erase(0, 4);

        return s.str();
    }